

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O1

void migrate_version(string_view path)

{
  source_loc loc;
  source_loc loc_00;
  bool bVar1;
  json_value __n;
  size_type sVar2;
  int iVar3;
  logger *plVar4;
  _Cmpt *this;
  string_view path_00;
  string_view filename;
  string_view_t fmt;
  string version;
  json db_json;
  string prev_version;
  string db_name;
  string most_recent;
  path db_root;
  undefined1 local_178 [8];
  json_value local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  pointer local_158;
  undefined1 uStack_150;
  undefined7 uStack_14f;
  undefined1 uStack_148;
  undefined8 uStack_147;
  undefined1 local_138 [8];
  json_value local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108;
  char *local_100;
  long local_f8 [2];
  long *local_e8;
  object_t *local_e0;
  long local_d8 [2];
  _Cmpt local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  path local_70;
  
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"1.5.0","");
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)local_178,&local_80);
  std::experimental::filesystem::v1::__cxx11::path::parent_path();
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_178);
  this = &local_c8;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&this->super_path,&local_80);
  if (local_c8.super_path._M_pathname._M_string_length == 0) {
    local_170.object = (object_t *)0x0;
    local_168._M_local_buf[0] = '\0';
    local_158 = (pointer)0x0;
    uStack_150 = 0;
    uStack_14f = 0;
    uStack_148 = 0;
    uStack_147 = 0;
    local_178 = (undefined1  [8])(local_178 + 0x10);
  }
  else {
    if (local_c8.super_path._M_type != _Multi) {
      local_c8.super_path._M_cmpts.
      super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    if (local_c8.super_path._M_type == _Multi) {
      this = local_c8.super_path._M_cmpts.
             super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    std::experimental::filesystem::v1::__cxx11::path::path((path *)local_178,&this->super_path);
  }
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,local_178,
             (pointer)((long)local_178 + (long)&(local_170.object)->_M_t));
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_178);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_c8.super_path);
  do {
    path_00._M_str = local_100;
    path_00._M_len = (size_t)&local_70;
    read_json((path *)local_178,path_00);
    local_138[0] = local_178[0];
    local_130 = local_170;
    local_178 = (undefined1  [8])((ulong)local_178 & 0xffffffffffffff00);
    local_170.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_178 + 8),null);
    extract_version((string *)local_178,(json *)local_138);
    sVar2 = local_128._M_string_length;
    __n = local_170;
    if (local_170.object == (object_t *)local_128._M_string_length) {
      if ((local_170.object != (object_t *)0x0) &&
         (iVar3 = bcmp((void *)local_178,local_128._M_dataplus._M_p,local_170.number_unsigned),
         iVar3 != 0)) {
        if (__n.object != (object_t *)sVar2) goto LAB_0013f91f;
        iVar3 = bcmp((void *)local_178,local_128._M_dataplus._M_p,__n.number_unsigned);
        if (((object_t *)sVar2 != (object_t *)0x0) && (iVar3 != 0)) goto LAB_0013f924;
        goto LAB_0013f97a;
      }
      plVar4 = spdlog::default_logger_raw();
      local_c8.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_c8.super_path._M_pathname._M_string_length = 0;
      local_c8.super_path._M_pathname.field_2._M_allocated_capacity = 0;
      loc_00.funcname = (char *)0x0;
      loc_00.filename = (char *)0x0;
      loc_00.line = 0;
      loc_00._12_4_ = 0;
      spdlog::logger::log<char[47],_nullptr>
                (plVar4,loc_00,err,(char (*) [47])"Upgrade procedure failed. Trying to proceed...");
LAB_0013fa5a:
      bVar1 = false;
    }
    else {
LAB_0013f91f:
      if ((object_t *)sVar2 != (object_t *)0x0) {
LAB_0013f924:
        plVar4 = spdlog::default_logger_raw();
        local_c8.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
        local_c8.super_path._M_pathname._M_string_length = 0;
        local_c8.super_path._M_pathname.field_2._M_allocated_capacity = 0;
        loc.funcname = (char *)0x0;
        loc.filename = (char *)0x0;
        loc.line = 0;
        loc._12_4_ = 0;
        fmt.size_ = 0x12;
        fmt.data_ = "UPGRADE: {} -> {}.";
        spdlog::logger::log<std::__cxx11::string,std::__cxx11::string>
                  (plVar4,loc,info,fmt,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
      }
LAB_0013f97a:
      if ((local_170.object == local_e0) &&
         ((local_170.object == (object_t *)0x0 ||
          (iVar3 = bcmp((void *)local_178,local_e8,local_170.number_unsigned), iVar3 == 0))))
      goto LAB_0013fa5a;
      iVar3 = std::__cxx11::string::compare((char *)local_178);
      if (iVar3 == 0) {
        upgrade_v1_0_0((json *)local_138);
      }
      iVar3 = std::__cxx11::string::compare((char *)local_178);
      if (iVar3 == 0) {
        upgrade_v1_3_2(&local_70,(json *)local_138);
      }
      std::__cxx11::string::_M_assign((string *)&local_128);
      bVar1 = true;
      filename._M_str = (char *)local_108;
      filename._M_len = (size_t)local_100;
      save_json(&local_70,filename,(json *)local_138);
    }
    if (local_178 != (undefined1  [8])(local_178 + 0x10)) {
      operator_delete((void *)local_178,
                      CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]) + 1)
      ;
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_138 + 8),local_138[0]);
    if (!bVar1) {
      if (local_108 != local_f8) {
        operator_delete(local_108,local_f8[0] + 1);
      }
      std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                 local_128.field_2._M_local_buf[0]) + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void migrate_version(std::string_view path) {
    std::string most_recent = "1.5.0";
    std::string prev_version;
    auto db_root = fs::path(path).parent_path();
    auto db_name = std::string(fs::path(path).filename());
    while (true) {
        json db_json = std::move(read_json(db_root, db_name));
        std::string version = extract_version(db_json);
        if (version == prev_version) {
            spdlog::error("Upgrade procedure failed. Trying to proceed...");
            break;
        }
        if (version != prev_version && !prev_version.empty()) {
            spdlog::info("UPGRADE: {} -> {}.", prev_version, version);
        }
        if (version == most_recent) {
            break;
        }
        if (version == "1.0.0") {
            upgrade_v1_0_0(&db_json);
        }
        if (version == "1.3.2") {
            upgrade_v1_3_2(db_root, &db_json);
        }
        prev_version = version;
        save_json(db_root, db_name, db_json);
    }
}